

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cc
# Opt level: O2

int __thiscall
flow::PhiNode::clone(PhiNode *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  pointer in_RAX;
  pointer local_18;
  
  local_18 = in_RAX;
  std::
  make_unique<flow::PhiNode,std::vector<flow::Value*,std::allocator<flow::Value*>>const&,std::__cxx11::string_const&>
            ((vector<flow::Value_*,_std::allocator<flow::Value_*>_> *)&local_18,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(__fn + 0x50));
  (this->super_Instr).super_Value._vptr_Value = (_func_int **)local_18;
  return (int)this;
}

Assistant:

std::unique_ptr<Instr> PhiNode::clone() {
  return std::make_unique<PhiNode>(operands(), name());
}